

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O2

void ssh_bpp_output_raw_data_callback(void *vctx)

{
  bufchain *ch;
  size_t sVar1;
  ulong bufsize;
  ptrlen pVar2;
  
  if (*vctx != 0) {
    ch = (bufchain *)((long)vctx + 0x118);
    while( true ) {
      sVar1 = bufchain_size(ch);
      if (sVar1 == 0) break;
      pVar2 = bufchain_prefix(ch);
      sVar1 = pVar2.len;
      if (*(LogContext **)((long)vctx + 0x60) != (LogContext *)0x0) {
        log_packet(*(LogContext **)((long)vctx + 0x60),1,-1,(char *)0x0,pVar2.ptr,sVar1,0,
                   (logblank_t *)0x0,(unsigned_long *)0x0,0,(char *)0x0);
      }
      bufsize = (**(code **)(**vctx + 0x10))(*vctx,pVar2.ptr,sVar1);
      bufchain_consume(ch,sVar1);
      if (0x8000 < bufsize) {
        ssh_throttle_all((Ssh *)vctx,true,bufsize);
        return;
      }
    }
    ssh_check_frozen((Ssh *)vctx);
    if (*(char *)((long)vctx + 0x168) == '\x01') {
      (**(code **)(**vctx + 8))();
      *(undefined8 *)vctx = 0;
      (**(code **)(**(long **)((long)vctx + 8) + 0x38))();
      return;
    }
  }
  return;
}

Assistant:

static void ssh_bpp_output_raw_data_callback(void *vctx)
{
    Ssh *ssh = (Ssh *)vctx;

    if (!ssh->s)
        return;

    while (bufchain_size(&ssh->out_raw) > 0) {
        size_t backlog;

        ptrlen data = bufchain_prefix(&ssh->out_raw);

        if (ssh->logctx)
            log_packet(ssh->logctx, PKT_OUTGOING, -1, NULL, data.ptr, data.len,
                       0, NULL, NULL, 0, NULL);
        backlog = sk_write(ssh->s, data.ptr, data.len);

        bufchain_consume(&ssh->out_raw, data.len);

        if (backlog > SSH_MAX_BACKLOG) {
            ssh_throttle_all(ssh, true, backlog);
            return;
        }
    }

    ssh_check_frozen(ssh);

    if (ssh->pending_close) {
        sk_close(ssh->s);
        ssh->s = NULL;
        seat_notify_remote_disconnect(ssh->seat);
    }
}